

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O0

vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> * __thiscall
cfd::AddressFactory::GetAddressesFromMultisig
          (AddressFactory *this,AddressType address_type,Script *redeem_script,
          vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkey_list)

{
  bool bVar1;
  undefined8 uVar2;
  Script *in_RCX;
  int in_EDX;
  CfdException *in_RSI;
  string *in_RDI;
  long in_R8;
  Pubkey *pubkey;
  iterator __end1;
  iterator __begin1;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__range1;
  Script script;
  Address addr;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *addr_list;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *in_stack_fffffffffffff8c8;
  Address *in_stack_fffffffffffff8d0;
  value_type *in_stack_fffffffffffff8d8;
  allocator *paVar3;
  CfdError error_code;
  string *psVar4;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *in_stack_fffffffffffff968;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *in_stack_fffffffffffff970;
  Address local_590;
  Script local_418;
  Address local_3e0;
  reference local_268;
  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
  local_260;
  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
  local_258;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *local_250;
  Script local_248;
  Address local_210;
  byte local_91;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_90;
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  char *local_40;
  undefined4 local_38;
  char *local_30;
  long local_28;
  int local_14;
  
  if (((in_EDX != 2) && (in_EDX != 4)) && (in_EDX != 6)) {
    psVar4 = in_RDI;
    local_40 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_address.cpp"
                       ,0x2f);
    error_code = (CfdError)((ulong)psVar4 >> 0x20);
    local_40 = local_40 + 1;
    local_38 = 0x130;
    local_30 = "GetAddressesFromMultisig";
    core::logger::warn<cfd::core::AddressType&>
              ((CfdSourceLocation *)in_stack_fffffffffffff8d0,(char *)in_stack_fffffffffffff8c8,
               (AddressType *)0x527194);
    local_75 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar3 = &local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_60,
               "Invalid address_type. address_type must be \"p2pkh\" \"p2wpkh\" or \"p2sh-p2wpkh\"."
               ,paVar3);
    core::CfdException::CfdException(in_RSI,error_code,in_RDI);
    local_75 = 0;
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  psVar4 = in_RDI;
  local_28 = in_R8;
  local_14 = in_EDX;
  core::ScriptUtil::ExtractPubkeysFromMultisigScript(&local_90,in_RCX,(uint32_t *)0x0);
  local_91 = 0;
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::vector
            ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)in_RDI);
  core::Address::Address(&local_210);
  core::Script::Script(&local_248);
  local_250 = &local_90;
  local_258._M_current =
       (Pubkey *)
       std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::begin
                 (in_stack_fffffffffffff8c8);
  local_260._M_current =
       (Pubkey *)
       std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::end
                 (in_stack_fffffffffffff8c8);
  while (bVar1 = __gnu_cxx::operator!=(&local_258,&local_260), bVar1) {
    local_268 = __gnu_cxx::
                __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                ::operator*(&local_258);
    if (local_14 == 2) {
      CreateP2pkhAddress((AddressFactory *)in_stack_fffffffffffff8d8,
                         (Pubkey *)in_stack_fffffffffffff8d0);
      core::Address::operator=(&local_210,&local_3e0);
      core::Address::~Address(in_stack_fffffffffffff8d0);
    }
    else if (local_14 == 6) {
      core::ScriptUtil::CreateP2wpkhLockingScript(&local_418,local_268);
      core::Script::operator=(&local_248,&local_418);
      core::Script::~Script((Script *)in_stack_fffffffffffff8d0);
      CreateP2shAddress((AddressFactory *)in_stack_fffffffffffff8d8,
                        (Script *)in_stack_fffffffffffff8d0);
      core::Address::operator=(&local_210,&local_590);
      core::Address::~Address(in_stack_fffffffffffff8d0);
    }
    else if (local_14 == 4) {
      CreateP2wpkhAddress((AddressFactory *)in_stack_fffffffffffff8d8,
                          (Pubkey *)in_stack_fffffffffffff8d0);
      core::Address::operator=(&local_210,(Address *)&stack0xfffffffffffff8f8);
      core::Address::~Address(in_stack_fffffffffffff8d0);
    }
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)in_RDI,
               in_stack_fffffffffffff8d8);
    __gnu_cxx::
    __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
    ::operator++(&local_258);
  }
  if (local_28 != 0) {
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator=
              (in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  }
  local_91 = 1;
  core::Script::~Script((Script *)in_stack_fffffffffffff8d0);
  core::Address::~Address(in_stack_fffffffffffff8d0);
  if ((local_91 & 1) == 0) {
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
              ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)in_RDI);
  }
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)in_RDI);
  return (vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)psVar4;
}

Assistant:

std::vector<Address> AddressFactory::GetAddressesFromMultisig(
    AddressType address_type, const Script& redeem_script,
    std::vector<Pubkey>* pubkey_list) const {
  if ((address_type != AddressType::kP2pkhAddress) &&
      (address_type != AddressType::kP2wpkhAddress) &&
      (address_type != AddressType::kP2shP2wpkhAddress)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to GetAddressesFromMultisig. Invalid address_type passed:  "
        "addressType={}",  // NOLINT
        address_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid address_type. address_type must be \"p2pkh\" "
        "\"p2wpkh\" or \"p2sh-p2wpkh\".");  // NOLINT
  }

  std::vector<Pubkey> pubkeys =
      ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script);

  std::vector<Address> addr_list;
  Address addr;
  Script script;
  for (const auto& pubkey : pubkeys) {
    if (address_type == AddressType::kP2pkhAddress) {
      addr = CreateP2pkhAddress(pubkey);
    } else if (address_type == AddressType::kP2shP2wpkhAddress) {
      script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
      addr = CreateP2shAddress(script);
    } else if (address_type == AddressType::kP2wpkhAddress) {
      // Currently we support only witness version 0.
      addr = CreateP2wpkhAddress(pubkey);
    }
    addr_list.push_back(addr);
  }

  if (pubkey_list) *pubkey_list = pubkeys;
  return addr_list;
}